

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

void __thiscall MidiInAlsa::~MidiInAlsa(MidiInAlsa *this)

{
  bool *__buf;
  undefined8 *puVar1;
  pthread_t __thread1;
  int iVar2;
  
  (this->super_MidiInApi).super_MidiApi._vptr_MidiApi = (_func_int **)&PTR__MidiInAlsa_00115bd0;
  closePort(this);
  puVar1 = (undefined8 *)(this->super_MidiInApi).super_MidiApi.apiData_;
  if ((this->super_MidiInApi).inputData_.doInput == true) {
    __buf = &(this->super_MidiInApi).inputData_.doInput;
    *__buf = false;
    write(*(int *)(puVar1 + 10),__buf,1);
    __thread1 = puVar1[6];
    iVar2 = pthread_equal(__thread1,puVar1[7]);
    if (iVar2 == 0) {
      pthread_join(__thread1,(void **)0x0);
    }
  }
  close(*(int *)((long)puVar1 + 0x4c));
  close(*(int *)(puVar1 + 10));
  if (-1 < *(int *)((long)puVar1 + 0xc)) {
    snd_seq_delete_port(*puVar1);
  }
  snd_seq_free_queue(*puVar1,*(undefined4 *)(puVar1 + 9));
  snd_seq_close(*puVar1);
  operator_delete(puVar1,0x58);
  MidiInApi::~MidiInApi(&this->super_MidiInApi);
  return;
}

Assistant:

MidiInAlsa :: ~MidiInAlsa()
{
  // Close a connection if it exists.
  MidiInAlsa::closePort();

  // Shutdown the input thread.
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  if ( inputData_.doInput ) {
    inputData_.doInput = false;
    int res = write( data->trigger_fds[1], &inputData_.doInput, sizeof( inputData_.doInput ) );
    (void) res;
    if ( !pthread_equal(data->thread, data->dummy_thread_id) )
      pthread_join( data->thread, NULL );
  }

  // Cleanup.
  close ( data->trigger_fds[0] );
  close ( data->trigger_fds[1] );
  if ( data->vport >= 0 ) snd_seq_delete_port( data->seq, data->vport );
#ifndef AVOID_TIMESTAMPING
  snd_seq_free_queue( data->seq, data->queue_id );
#endif
  snd_seq_close( data->seq );
  delete data;
}